

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumConstantOptions
          (Parser *this,EnumValueDescriptorProto *value,LocationRecorder *enum_value_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  EnumValueOptions *options;
  undefined1 local_40 [8];
  LocationRecorder location;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *enum_value_location_local;
  EnumValueDescriptorProto *value_local;
  Parser *this_local;
  
  location.location_ = (Location *)containing_file;
  bVar1 = LookingAt(this,"[");
  if (bVar1) {
    LocationRecorder::LocationRecorder((LocationRecorder *)local_40,enum_value_location,3);
    bVar1 = Consume(this,"[");
    if (bVar1) {
      do {
        options = EnumValueDescriptorProto::mutable_options(value);
        bVar1 = ParseOption(this,&options->super_Message,(LocationRecorder *)local_40,
                            (FileDescriptorProto *)location.location_,OPTION_ASSIGNMENT);
        if (!bVar1) {
          this_local._7_1_ = false;
          goto LAB_004c4c83;
        }
        bVar1 = TryConsume(this,",");
      } while (bVar1);
      bVar1 = Consume(this,"]");
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
LAB_004c4c83:
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_40);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseEnumConstantOptions(
    EnumValueDescriptorProto* value,
    const LocationRecorder& enum_value_location,
    const FileDescriptorProto* containing_file) {
  if (!LookingAt("[")) return true;

  LocationRecorder location(
      enum_value_location, EnumValueDescriptorProto::kOptionsFieldNumber);

  DO(Consume("["));

  do {
    DO(ParseOption(value->mutable_options(), location,
                   containing_file, OPTION_ASSIGNMENT));
  } while (TryConsume(","));

  DO(Consume("]"));
  return true;
}